

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_literal_expr(gvisitor_t *self,gnode_literal_expr_t *node)

{
  long *plVar1;
  gravity_function_t *f;
  ircode_t *code;
  gravity_vm *pgVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t p1;
  uint32_t p1_00;
  gnode_t *node_00;
  undefined8 uVar5;
  gravity_value_t gVar6;
  
  plVar1 = (long *)self->data;
  f = *(gravity_function_t **)(plVar1[2] + -8 + *plVar1 * 8);
  if ((f != (gravity_function_t *)0x0) && (f->isa == gravity_class_function)) {
    if (LITERAL_STRING_INTERPOLATED < node->type) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                    ,0x729,"void visit_literal_expr(gvisitor_t *, gnode_literal_expr_t *)");
    }
    code = *(ircode_t **)((long)&f->field_9 + 0x50);
    switch(node->type) {
    case LITERAL_STRING:
      pgVar2 = (gravity_vm *)plVar1[7];
      gVar6 = gravity_string_to_value((gravity_vm *)0x0,(node->value).str,node->len);
      uVar3 = gravity_function_cpool_add(pgVar2,f,gVar6);
      uVar4 = (uint32_t)uVar3;
      break;
    case LITERAL_FLOAT:
      ircode_add_double(code,(node->value).d,(node->base).token.lineno);
      return;
    case LITERAL_INT:
      ircode_add_int(code,(node->value).n64,(node->base).token.lineno);
      return;
    case LITERAL_BOOL:
      uVar4 = ((node->value).str == (char *)0x0) + 0x1005;
      break;
    case LITERAL_STRING_INTERPOLATED:
      node_00 = gnode_list_expr_create
                          ((node->base).token,(node->value).r,(gnode_r *)0x0,false,
                           (gnode_t *)(node->base).decl);
      gvisit(self,node_00);
      uVar4 = ircode_register_last(code);
      if (uVar4 == 0xffffffff) {
        report_error(self,&node->base,"Invalid string interpolated expression.");
      }
      pgVar2 = *(gravity_vm **)((long)self->data + 0x38);
      gVar6 = gravity_string_to_value((gravity_vm *)0x0,"join",0xffffffff);
      uVar3 = gravity_function_cpool_add(pgVar2,f,gVar6);
      ircode_add_constant(code,(uint)uVar3,(node->base).token.lineno);
      p1 = ircode_register_last(code);
      if (p1 == 0xffffffff) {
        uVar5 = 0x707;
      }
      else {
        ircode_add(code,LOAD,p1,uVar4,p1,(node->base).token.lineno);
        p1_00 = ircode_register_push_temp(code);
        ircode_add(code,MOVE,p1_00,uVar4,0,(node->base).token.lineno);
        ircode_add(code,CALL,uVar4,p1,1,(node->base).token.lineno);
        free(node_00);
        uVar4 = ircode_register_pop(code);
        if (uVar4 == 0xffffffff) {
          uVar5 = 0x718;
        }
        else {
          uVar4 = ircode_register_pop(code);
          if (uVar4 != 0xffffffff) {
            return;
          }
          uVar5 = 0x71a;
        }
      }
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,uVar5,"visit_literal_expr","Unexpected register error.");
      abort();
    }
    ircode_add_constant(code,uVar4,(node->base).token.lineno);
    return;
  }
  report_error(self,&node->base,"Invalid code context.");
  return;
}

Assistant:

static void visit_literal_expr (gvisitor_t *self, gnode_literal_expr_t *node) {
    /*

     NOTE:

     doubles and int64 should be added to the constant pool but I avoid
     adding them here so the optimizer has a way to perform better constant folding:
     http://en.wikipedia.org/wiki/Constant_folding
     http://www.compileroptimizations.com/category/constant_folding.htm

     */

    DEBUG_CODEGEN("visit_literal_expr");
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    switch (node->type) {
        case LITERAL_STRING: {
            // LOADK temp, s
            uint16_t index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_STRING(NULL, node->value.str, node->len));
			ircode_add_constant(code, index, LINE_NUMBER(node));
            DEBUG_CODEGEN("visit_literal_expr (string) %s", node->value.str);
        } break;

        case LITERAL_FLOAT:
            // LOADI temp, d
			ircode_add_double(code, node->value.d, LINE_NUMBER(node));
			DEBUG_CODEGEN("visit_literal_expr (float) %.5f", node->value.d);
            break;

        case LITERAL_INT:
            // LOADI temp, n
			ircode_add_int(code, node->value.n64, LINE_NUMBER(node));
            DEBUG_CODEGEN("visit_literal_expr (int) %lld", node->value.n64);
            break;

        case LITERAL_BOOL: {
            uint32_t value = (node->value.n64 == 0) ? CPOOL_VALUE_FALSE : CPOOL_VALUE_TRUE;
			ircode_add_constant(code, value, LINE_NUMBER(node));
            DEBUG_CODEGEN("visit_literal_expr (bool) %lld", node->value.n64);
        } break;

        case LITERAL_STRING_INTERPOLATED: {
            // codegen for string interpolation is like a list.join()

            gnode_list_expr_t *list = (gnode_list_expr_t *)gnode_list_expr_create(node->base.token, node->value.r, NULL, false, node->base.decl);
            visit((gnode_t *)list);

            // list
            uint32_t listreg = ircode_register_last(code);
            if (listreg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid string interpolated expression.");

            // LOADK
            uint16_t index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, "join"));
			ircode_add_constant(code, index, LINE_NUMBER(node));
            uint32_t temp1 = ircode_register_last(code);
            DEBUG_ASSERT(temp1 != REGISTER_ERROR, "Unexpected register error.");

            // LOAD
			ircode_add(code, LOAD, temp1, listreg, temp1, LINE_NUMBER(node));

            // temp1+1 register used for parameter passing
            uint32_t temp2 = ircode_register_push_temp(code);

            // MOVE
			ircode_add(code, MOVE, temp2, listreg, 0, LINE_NUMBER(node));

            // CALL
			ircode_add(code, CALL, listreg, temp1, 1, LINE_NUMBER(node));

            // cleanup
            mem_free(list);
            uint32_t temp = ircode_register_pop(code);    // temp2
            DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
            temp = ircode_register_pop(code);            // temp1
            DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");

            /*

             00012    LOADK 6 4
             00013    LOAD 6 4 6
             00014    MOVE 7 6
             00015    MOVE 8 4
             00016    CALL 6 7 1

             */

            break;
        }

        default: assert(0);
    }

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}